

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::BindImageMemory::prepare(BindImageMemory *this,PrepareContext *context)

{
  VkResult result;
  Context *pCVar1;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  VkImage VVar4;
  Memory *this_00;
  VkDeviceMemory VVar5;
  VkDevice device;
  DeviceInterface *vkd;
  PrepareContext *context_local;
  BindImageMemory *this_local;
  
  pCVar1 = PrepareContext::getContext(context);
  pDVar2 = Context::getDeviceInterface(pCVar1);
  pCVar1 = PrepareContext::getContext(context);
  pVVar3 = Context::getDevice(pCVar1);
  VVar4 = PrepareContext::getImage(context);
  this_00 = PrepareContext::getMemory(context);
  VVar5 = Memory::getMemory(this_00);
  result = (*pDVar2->_vptr_DeviceInterface[0xd])(pDVar2,pVVar3,VVar4.m_internal,VVar5.m_internal,0);
  ::vk::checkResult(result,
                    "vkd.bindImageMemory(device, context.getImage(), context.getMemory().getMemory(), 0)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x6b5);
  return;
}

Assistant:

void BindImageMemory::prepare (PrepareContext& context)
{
	const vk::DeviceInterface&		vkd				= context.getContext().getDeviceInterface();
	const vk::VkDevice				device			= context.getContext().getDevice();

	VK_CHECK(vkd.bindImageMemory(device, context.getImage(), context.getMemory().getMemory(), 0));
}